

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::SetFirstTmpReg(FunctionBody *this,RegSlot firstTmpReg)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  
  if (this->m_DEBUG_executionCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x514,"(m_DEBUG_executionCount == 0)",
                                "Function cannot be executing when modified");
    if (!bVar2) goto LAB_00768252;
    *puVar4 = 0;
  }
  if ((this->field_0x17d & 1) != 0) {
    uVar3 = GetCountField(this,FirstTmpRegister);
    if (uVar3 != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x4b4,"(GetFirstTmpRegister() == Constants::NoRegister)",
                                  "Should not be resetting the first temp");
      if (!bVar2) {
LAB_00768252:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  if (firstTmpReg != 0xffffffff) {
    *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c | 0x100;
    SetCountField(this,FirstTmpRegister,firstTmpReg);
    return;
  }
  *(ushort *)&this->field_0x17c = *(ushort *)&this->field_0x17c & 0xfeff;
  return;
}

Assistant:

void
    FunctionBody::SetFirstTmpReg(
        RegSlot firstTmpReg)
    {
        CheckNotExecuting();
        AssertMsg(GetFirstTmpRegister() == Constants::NoRegister, "Should not be resetting the first temp");

        SetFirstTmpRegister(firstTmpReg);
    }